

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InputDCTDecodeStream.cpp
# Opt level: O3

void __thiscall InputDCTDecodeStream::InputDCTDecodeStream(InputDCTDecodeStream *this)

{
  (this->super_IByteReader)._vptr_IByteReader = (_func_int **)&PTR__InputDCTDecodeStream_003a9330;
  this->mStream = (IByteReader *)0x0;
  this->mIsDecoding = false;
  this->mIndexInRow = 0;
  this->mCurrentSampleRow = 0;
  *(undefined8 *)((long)&this->mCurrentSampleRow + 1) = 0;
  *(undefined8 *)((long)&this->mTotalSampleRows + 1) = 0;
  return;
}

Assistant:

InputDCTDecodeStream::InputDCTDecodeStream(void)
{
    mStream = NULL;
	mIsDecoding = false;
    mIsHeaderRead = false;
    mCurrentSampleRow = 0;
    mTotalSampleRows = 0;
    mIndexInRow = 0;
}